

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# validation.c
# Opt level: O1

exr_result_t validate_channels(exr_context_t f,exr_priv_part_t curpart)

{
  uint uVar1;
  int iVar2;
  uint uVar3;
  exr_attribute_t *peVar4;
  exr_attr_chlist_t *peVar5;
  exr_attr_chlist_entry_t *peVar6;
  bool bVar7;
  uint uVar8;
  exr_result_t eVar9;
  ulong uVar10;
  _func_exr_result_t_exr_const_context_t_exr_result_t_char_ptr *UNRECOVERED_JUMPTABLE_00;
  ulong uVar11;
  ulong uVar12;
  undefined8 uVar13;
  _func_exr_result_t_exr_const_context_t_exr_result_t_char_ptr_varargs *UNRECOVERED_JUMPTABLE;
  char *pcVar14;
  ulong uVar15;
  long lVar16;
  long lVar17;
  
  peVar4 = curpart->channels;
  if (peVar4 == (exr_attribute_t *)0x0) {
    UNRECOVERED_JUMPTABLE = f->print_error;
    pcVar14 = "\'channels\' attribute not found";
    eVar9 = 0xd;
  }
  else {
    if (peVar4->type == EXR_ATTR_CHLIST) {
      if (curpart->dataWindow == (exr_attribute_t *)0x0) {
        UNRECOVERED_JUMPTABLE_00 = f->report_error;
        pcVar14 = "request to validate channel list, but data window not set to validate against";
        eVar9 = 0xf;
      }
      else {
        peVar5 = (peVar4->field_6).chlist;
        if (0 < peVar5->num_channels) {
          if (0 < peVar5->num_channels) {
            uVar1 = (curpart->data_window).min.x;
            iVar2 = (curpart->data_window).min.y;
            uVar10 = ((long)(curpart->data_window).max.x - (long)(int)uVar1) + 1;
            uVar11 = ((long)(curpart->data_window).max.y - (long)iVar2) + 1;
            lVar16 = 8;
            lVar17 = 0;
            uVar12 = uVar11;
            do {
              peVar6 = peVar5->entries;
              uVar8 = *(uint *)(peVar6->reserved + lVar16 + -5);
              if ((long)(int)uVar8 < 1) {
                uVar13 = *(undefined8 *)(peVar6->reserved + lVar16 + -0x15);
                pcVar14 = "channel \'%s\': x subsampling factor is invalid (%d)";
LAB_00134a49:
                uVar8 = (*f->print_error)(f,0xe,pcVar14,uVar13,(ulong)uVar8);
LAB_00134a76:
                bVar7 = false;
                uVar12 = (ulong)uVar8;
              }
              else {
                uVar3 = *(uint *)(peVar6->reserved + lVar16 + -1);
                uVar15 = (ulong)uVar3;
                if ((int)uVar3 < 1) {
                  uVar13 = *(undefined8 *)(peVar6->reserved + lVar16 + -0x15);
                  pcVar14 = "channel \'%s\': y subsampling factor is invalid (%d)";
                  uVar8 = uVar3;
                  goto LAB_00134a49;
                }
                if ((int)uVar1 % (int)uVar8 != 0) {
                  uVar13 = *(undefined8 *)(peVar6->reserved + lVar16 + -0x15);
                  pcVar14 = 
                  "channel \'%s\': minimum x coordinate (%d) of the data window is not a multiple of the x subsampling factor (%d)"
                  ;
                  uVar15 = (ulong)uVar8;
                  uVar12 = (ulong)uVar1;
LAB_00134a71:
                  uVar8 = (*f->print_error)(f,0xe,pcVar14,uVar13,uVar12,uVar15);
                  goto LAB_00134a76;
                }
                if (iVar2 % (int)uVar3 != 0) {
                  uVar13 = *(undefined8 *)(peVar6->reserved + lVar16 + -0x15);
                  pcVar14 = 
                  "channel \'%s\': minimum y coordinate (%d) of the data window is not a multiple of the y subsampling factor (%d)"
                  ;
                  uVar12 = (long)iVar2;
                  goto LAB_00134a71;
                }
                if ((long)uVar10 % (long)(int)uVar8 != 0) {
                  uVar13 = *(undefined8 *)(peVar6->reserved + lVar16 + -0x15);
                  pcVar14 = 
                  "channel \'%s\': row width (%ld) of the data window is not a multiple of the x subsampling factor (%d)"
                  ;
                  uVar15 = (ulong)uVar8;
                  uVar12 = uVar10;
LAB_00134af6:
                  uVar8 = (*f->print_error)(f,0xe,pcVar14,uVar13,uVar12,uVar15);
                  goto LAB_00134a76;
                }
                if ((long)uVar11 % (long)uVar15 != 0) {
                  uVar13 = *(undefined8 *)(peVar6->reserved + lVar16 + -0x15);
                  pcVar14 = 
                  "channel \'%s\': column height (%ld) of the data window is not a multiple of the y subsampling factor (%d)"
                  ;
                  uVar12 = uVar11;
                  goto LAB_00134af6;
                }
                bVar7 = true;
              }
              if (!bVar7) {
                return (exr_result_t)uVar12;
              }
              lVar17 = lVar17 + 1;
              lVar16 = lVar16 + 0x20;
            } while (lVar17 < peVar5->num_channels);
          }
          return 0;
        }
        UNRECOVERED_JUMPTABLE_00 = f->report_error;
        pcVar14 = "At least one channel required";
        eVar9 = 6;
      }
      eVar9 = (*UNRECOVERED_JUMPTABLE_00)(f,eVar9,pcVar14);
      return eVar9;
    }
    UNRECOVERED_JUMPTABLE = f->print_error;
    pcVar14 = "\'channels\' attribute has wrong data type, expect chlist";
    eVar9 = 0x10;
  }
  eVar9 = (*UNRECOVERED_JUMPTABLE)(f,eVar9,pcVar14,UNRECOVERED_JUMPTABLE);
  return eVar9;
}

Assistant:

static exr_result_t
validate_channels (
    exr_context_t f, exr_priv_part_t curpart)
{
    exr_attr_box2i_t         dw;
    int64_t                  w, h;
    const exr_attr_chlist_t* channels;

    if (!curpart->channels)
        return f->print_error (
            f, EXR_ERR_MISSING_REQ_ATTR, "'channels' attribute not found");
    else if (curpart->channels->type != EXR_ATTR_CHLIST)
        return f->print_error (
            f,
            EXR_ERR_ATTR_TYPE_MISMATCH,
            "'channels' attribute has wrong data type, expect chlist");

    channels = curpart->channels->chlist;

    if (!curpart->dataWindow)
        return f->report_error (
            f,
            EXR_ERR_NO_ATTR_BY_NAME,
            "request to validate channel list, but data window not set to validate against");

    if (channels->num_channels <= 0)
        return f->report_error (
            f, EXR_ERR_FILE_BAD_HEADER, "At least one channel required");

    dw = curpart->data_window;
    w  = (int64_t) dw.max.x - (int64_t) dw.min.x + 1;
    h  = (int64_t) dw.max.y - (int64_t) dw.min.y + 1;

    for (int c = 0; c < channels->num_channels; ++c)
    {
        int32_t xsamp = channels->entries[c].x_sampling;
        int32_t ysamp = channels->entries[c].y_sampling;

        if (xsamp < 1)
            return f->print_error (
                f,
                EXR_ERR_INVALID_ATTR,
                "channel '%s': x subsampling factor is invalid (%d)",
                channels->entries[c].name.str,
                xsamp);
        if (ysamp < 1)
            return f->print_error (
                f,
                EXR_ERR_INVALID_ATTR,
                "channel '%s': y subsampling factor is invalid (%d)",
                channels->entries[c].name.str,
                ysamp);
        if (dw.min.x % xsamp)
            return f->print_error (
                f,
                EXR_ERR_INVALID_ATTR,
                "channel '%s': minimum x coordinate (%d) of the data window is not a multiple of the x subsampling factor (%d)",
                channels->entries[c].name.str,
                dw.min.x,
                xsamp);
        if (dw.min.y % ysamp)
            return f->print_error (
                f,
                EXR_ERR_INVALID_ATTR,
                "channel '%s': minimum y coordinate (%d) of the data window is not a multiple of the y subsampling factor (%d)",
                channels->entries[c].name.str,
                dw.min.y,
                ysamp);
        if (w % xsamp)
            return f->print_error (
                f,
                EXR_ERR_INVALID_ATTR,
                "channel '%s': row width (%" PRId64
                ") of the data window is not a multiple of the x subsampling factor (%d)",
                channels->entries[c].name.str,
                w,
                xsamp);
        if (h % ysamp)
            return f->print_error (
                f,
                EXR_ERR_INVALID_ATTR,
                "channel '%s': column height (%" PRId64
                ") of the data window is not a multiple of the y subsampling factor (%d)",
                channels->entries[c].name.str,
                h,
                ysamp);
    }

    return EXR_ERR_SUCCESS;
}